

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void LiteScript::StateExecutor::I_JUMP_IF(State *state,Instruction *instr)

{
  pointer pVVar1;
  bool bVar2;
  Object *pOVar3;
  Type *pTVar4;
  Variable v1;
  Variable tmp;
  Variable VStack_38;
  Variable local_28;
  
  state->line_num = state->line_num + 1;
  pVVar1 = (state->op_lifo).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar1 == (state->op_lifo).
                super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                _M_impl.super__Vector_impl_data._M_start) {
    return;
  }
  if (instr->comp_type == '\x02') {
    Variable::Convert(&VStack_38,(Type *)(pVVar1 + -1));
    PopValue(state);
    pOVar3 = Variable::operator->(&VStack_38);
    pTVar4 = Object::GetType(pOVar3);
    bVar2 = Type::operator==(pTVar4,(Type *)_type_boolean);
    if ((bVar2) && (pOVar3 = Variable::operator->(&VStack_38), *pOVar3->data == '\x01')) {
      state->line_num = (instr->comp_value).v_integer;
    }
    else {
      Variable::Convert(&local_28,(Type *)&VStack_38);
      pOVar3 = Variable::operator->(&local_28);
      pTVar4 = Object::GetType(pOVar3);
      bVar2 = Type::operator==(pTVar4,(Type *)_type_boolean);
      if ((bVar2) && (pOVar3 = Variable::operator->(&local_28), *pOVar3->data == '\x01')) {
        state->line_num = (instr->comp_value).v_integer;
      }
      Variable::~Variable(&local_28);
    }
    Variable::~Variable(&VStack_38);
    return;
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_JUMP_IF(State& state, Instruction& instr) {
    state.line_num++;
    if (state.op_lifo.size() < 1 || instr.comp_type != Instruction::CompType::COMP_TYPE_INTEGER)
        return;
    Variable v1(state.op_lifo.back().Convert(Type::BOOLEAN));
    PopValue(state);
    if (v1->GetType() == Type::BOOLEAN && v1->GetData<bool>())
        state.line_num = (unsigned int) instr.comp_value.v_integer;
    else {
        Variable tmp = v1.Convert(Type::BOOLEAN);
        if (tmp->GetType() == Type::BOOLEAN && tmp->GetData<bool>())
            state.line_num = (unsigned int) instr.comp_value.v_integer;
    }
}